

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O0

Result * CoreML::checkRank(Result *__return_storage_ptr__,NeuralNetworkLayer *layer,
                          string *layerType,int min,int max,string *blobType,int rank)

{
  string *psVar1;
  string local_4e8;
  string local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  string local_368;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined4 local_1e4;
  string local_1e0;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string err;
  string *blobType_local;
  int max_local;
  int min_local;
  string *layerType_local;
  NeuralNetworkLayer *layer_local;
  
  err.field_2._8_8_ = blobType;
  if (max < min && -1 < max) {
    __assert_fail("min <= max || max < 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/src/Validation/NeuralNetwork/NeuralNetworkValidatorUtils.hpp"
                  ,0x27,
                  "Result CoreML::checkRank(const Specification::NeuralNetworkLayer &, const std::string &, int, int, const std::string &, int)"
                 );
  }
  std::__cxx11::string::string((string *)local_50);
  if (((max < 1) || (max != min)) || (rank == max)) {
    if ((min < 1) || (min <= rank)) {
      if ((max < 1) || (rank <= max)) {
        Result::Result(__return_storage_ptr__);
      }
      else {
        psVar1 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
        std::operator+(&local_4a8,"Layer \'",psVar1);
        std::operator+(&local_488,&local_4a8,"\' of type \'");
        std::operator+(&local_468,&local_488,layerType);
        std::operator+(&local_448,&local_468,"\' has ");
        std::operator+(&local_428,&local_448,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       err.field_2._8_8_);
        std::operator+(&local_408,&local_428," rank ");
        std::__cxx11::to_string(&local_4c8,rank);
        std::operator+(&local_3e8,&local_408,&local_4c8);
        std::operator+(&local_3c8,&local_3e8," but expects rank at most ");
        std::__cxx11::to_string(&local_4e8,max);
        std::operator+(&local_3a8,&local_3c8,&local_4e8);
        std::operator+(&local_388,&local_3a8,".");
        std::__cxx11::string::operator=((string *)local_50,(string *)&local_388);
        std::__cxx11::string::~string((string *)&local_388);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_408);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_468);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_4a8);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_50);
      }
    }
    else {
      psVar1 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
      std::operator+(&local_328,"Layer \'",psVar1);
      std::operator+(&local_308,&local_328,"\' of type \'");
      std::operator+(&local_2e8,&local_308,layerType);
      std::operator+(&local_2c8,&local_2e8,"\' has ");
      std::operator+(&local_2a8,&local_2c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     err.field_2._8_8_);
      std::operator+(&local_288,&local_2a8," rank ");
      std::__cxx11::to_string(&local_348,rank);
      std::operator+(&local_268,&local_288,&local_348);
      std::operator+(&local_248,&local_268," but expects rank at least ");
      std::__cxx11::to_string(&local_368,min);
      std::operator+(&local_228,&local_248,&local_368);
      std::operator+(&local_208,&local_228,".");
      std::__cxx11::string::operator=((string *)local_50,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_328);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_50);
    }
  }
  else {
    psVar1 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
    std::operator+(&local_190,"Layer \'",psVar1);
    std::operator+(&local_170,&local_190,"\' of type \'");
    std::operator+(&local_150,&local_170,layerType);
    std::operator+(&local_130,&local_150,"\' has ");
    std::operator+(&local_110,&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   err.field_2._8_8_);
    std::operator+(&local_f0,&local_110," rank ");
    std::__cxx11::to_string(&local_1c0,rank);
    std::operator+(&local_d0,&local_f0,&local_1c0);
    std::operator+(&local_b0,&local_d0," but expects rank exactly ");
    std::__cxx11::to_string(&local_1e0,min);
    std::operator+(&local_90,&local_b0,&local_1e0);
    std::operator+(&local_70,&local_90,".");
    std::__cxx11::string::operator=((string *)local_50,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_50);
  }
  local_1e4 = 1;
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

inline Result checkRank(const Specification::NeuralNetworkLayer& layer,
                        const std::string &layerType, int min, int max,
                        const std::string &blobType, int rank) {
    
    // blobType: "input" or "output"
    
    assert( min <= max || max < 0 );
    std::string err;
    
    if (max > 0 && max == min && rank != max) {
        err = "Layer '" + layer.name() + "' of type '" + layerType + + "' has " + blobType  + " rank " + std::to_string(rank) + " but expects rank exactly " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (min > 0 && rank < min) {
        err = "Layer '" + layer.name() + "' of type '" + layerType + + "' has " + blobType + " rank " + std::to_string(rank) + " but expects rank at least " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (max > 0 && rank > max) {
        err = "Layer '" + layer.name() + "' of type '" + layerType + "' has " + blobType + " rank " + std::to_string(rank) + " but expects rank at most " + std::to_string(max) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    } else {
        return Result();
    }
}